

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSSLWraper.cpp
# Opt level: O1

string * __thiscall
OpenSSLWrapper::SslConnection::GetSelAlpnProtocol_abi_cxx11_
          (string *__return_storage_ptr__,SslConnection *this)

{
  uint iProtoLen;
  uchar *cpAlpnProto;
  uint local_24;
  long local_20;
  
  local_20 = 0;
  local_24 = 0;
  SSL_get0_alpn_selected(this->m_ssl,&local_20,&local_24);
  if (local_24 == 0 || local_20 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,local_20,(ulong)local_24 + local_20);
  }
  return __return_storage_ptr__;
}

Assistant:

string SslConnection::GetSelAlpnProtocol()
    {
        const unsigned char* cpAlpnProto = nullptr;
        unsigned int iProtoLen = 0;
        SSL_get0_alpn_selected(m_ssl, &cpAlpnProto, &iProtoLen);
        if (cpAlpnProto != nullptr && iProtoLen > 0)
            return string(reinterpret_cast<const char*>(cpAlpnProto), iProtoLen);

        return string();
    }